

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackRPMGenerator.cxx
# Opt level: O1

int __thiscall cmCPackRPMGenerator::InitializeInternal(cmCPackRPMGenerator *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  bool bVar4;
  int iVar5;
  cmValue cVar6;
  string *psVar7;
  size_type sVar8;
  string_view value;
  string packageName;
  string local_60;
  string local_40;
  
  paVar1 = &local_60.field_2;
  local_60._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_60,"CPACK_PACKAGING_INSTALL_PREFIX","");
  cmCPackGenerator::SetOptionIfNotSet(&this->super_cmCPackGenerator,&local_60,"/usr");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  local_60._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"CPACK_SET_DESTDIR","");
  cVar6 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_60);
  if (cVar6.Value == (string *)0x0) {
    bVar4 = true;
  }
  else {
    value._M_str = ((cVar6.Value)->_M_dataplus)._M_p;
    value._M_len = (cVar6.Value)->_M_string_length;
    bVar4 = cmValue::IsOff(value);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if (bVar4 != false) {
    local_60._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"CPACK_SET_DESTDIR","");
    cmCPackGenerator::SetOption(&this->super_cmCPackGenerator,&local_60,"I_ON");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != paVar1) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
  }
  local_60._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"CPACK_PACKAGE_NAME","");
  cVar6 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if (cVar6.Value != (string *)0x0) {
    paVar2 = &local_40.field_2;
    local_40._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"CPACK_PACKAGE_NAME","");
    psVar7 = (string *)cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_40);
    if (psVar7 == (string *)0x0) {
      psVar7 = &cmValue::Empty_abi_cxx11_;
    }
    pcVar3 = (psVar7->_M_dataplus)._M_p;
    local_60._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_60,pcVar3,pcVar3 + psVar7->_M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != paVar2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    if (local_60._M_string_length != 0) {
      sVar8 = 0;
      do {
        if (local_60._M_dataplus._M_p[sVar8] == ' ') {
          local_60._M_dataplus._M_p[sVar8] = '-';
        }
        sVar8 = sVar8 + 1;
      } while (local_60._M_string_length != sVar8);
    }
    local_40._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"CPACK_PACKAGE_NAME","");
    cmCPackGenerator::SetOption(&this->super_cmCPackGenerator,&local_40,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != paVar2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != paVar1) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
  }
  local_60._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"CPACK_PACKAGE_FILE_NAME","");
  cVar6 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if (cVar6.Value != (string *)0x0) {
    paVar2 = &local_40.field_2;
    local_40._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"CPACK_PACKAGE_FILE_NAME","");
    psVar7 = (string *)cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_40);
    if (psVar7 == (string *)0x0) {
      psVar7 = &cmValue::Empty_abi_cxx11_;
    }
    pcVar3 = (psVar7->_M_dataplus)._M_p;
    local_60._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_60,pcVar3,pcVar3 + psVar7->_M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != paVar2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    if (local_60._M_string_length != 0) {
      sVar8 = 0;
      do {
        if (local_60._M_dataplus._M_p[sVar8] == ' ') {
          local_60._M_dataplus._M_p[sVar8] = '-';
        }
        sVar8 = sVar8 + 1;
      } while (local_60._M_string_length != sVar8);
    }
    local_40._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"CPACK_PACKAGE_FILE_NAME","");
    cmCPackGenerator::SetOption(&this->super_cmCPackGenerator,&local_40,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != paVar2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != paVar1) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
  }
  iVar5 = cmCPackGenerator::InitializeInternal(&this->super_cmCPackGenerator);
  return iVar5;
}

Assistant:

int cmCPackRPMGenerator::InitializeInternal()
{
  this->SetOptionIfNotSet("CPACK_PACKAGING_INSTALL_PREFIX", "/usr");
  if (cmIsOff(this->GetOption("CPACK_SET_DESTDIR"))) {
    this->SetOption("CPACK_SET_DESTDIR", "I_ON");
  }
  /* Replace space in CPACK_PACKAGE_NAME in order to avoid
   * rpmbuild scream on unwanted space in filename issue
   * Moreover RPM file do not usually embed space in filename
   */
  if (this->GetOption("CPACK_PACKAGE_NAME")) {
    std::string packageName = this->GetOption("CPACK_PACKAGE_NAME");
    std::replace(packageName.begin(), packageName.end(), ' ', '-');
    this->SetOption("CPACK_PACKAGE_NAME", packageName);
  }
  /* same for CPACK_PACKAGE_FILE_NAME */
  if (this->GetOption("CPACK_PACKAGE_FILE_NAME")) {
    std::string packageName = this->GetOption("CPACK_PACKAGE_FILE_NAME");
    std::replace(packageName.begin(), packageName.end(), ' ', '-');
    this->SetOption("CPACK_PACKAGE_FILE_NAME", packageName);
  }
  return this->Superclass::InitializeInternal();
}